

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O1

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
::matches(Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
          *this,candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_>
                *candidate)

{
  int32_t *piVar1;
  matched_t<wasm::Match::Internal::ExactKind<int>_> casted_1;
  int32_t iVar2;
  bool bVar3;
  Literal local_b0;
  Literal local_98;
  Literal local_80;
  Literal local_68;
  Literal local_50;
  undefined1 auStack_38 [8];
  matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> casted;
  
  auStack_38 = (undefined1  [8])0x0;
  casted.field_0.i64 = 0;
  casted.field_0.func.super_IString.str._M_str = (char *)0x0;
  Literal::Literal(&local_98,candidate);
  Literal::operator=((Literal *)auStack_38,&local_98);
  Literal::~Literal(&local_98);
  if (this->binder != (Literal *)0x0) {
    Literal::operator=(this->binder,(Literal *)auStack_38);
  }
  Literal::Literal(&local_80,(Literal *)auStack_38);
  Literal::Literal(&local_50,&local_80);
  Literal::~Literal(&local_50);
  if (local_50.type.id == 2) {
    Literal::Literal(&local_68,(Literal *)auStack_38);
    Literal::Literal(&local_50,&local_68);
    iVar2 = GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0>::
            operator()((GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0>
                        *)((long)&casted.type.id + 7),&local_50);
    piVar1 = (this->submatchers).curr.binder;
    if (piVar1 != (int32_t *)0x0) {
      *piVar1 = iVar2;
    }
    bVar3 = (this->submatchers).curr.data == iVar2;
    if (bVar3) {
      Literal::Literal(&local_b0,&local_68);
      Literal::~Literal(&local_b0);
    }
    Literal::~Literal(&local_50);
  }
  else {
    bVar3 = false;
  }
  if (local_50.type.id == 2) {
    Literal::~Literal(&local_68);
  }
  Literal::~Literal(&local_80);
  Literal::~Literal((Literal *)auStack_38);
  return bVar3;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }